

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuRasterizationVerifier.cpp
# Opt level: O0

void tcu::anon_unknown_3::applyClippingBox(Vec2 *line,float w)

{
  float fVar1;
  int iVar2;
  float *pfVar3;
  int componentNdx;
  float fVar4;
  float newCoord;
  float t;
  int component;
  int sign;
  int side;
  float w_local;
  Vec2 *line_local;
  
  for (component = 0; component < 4; component = component + 1) {
    iVar2 = (component / 2) * -2 + 1;
    componentNdx = component % 2;
    fVar4 = calculateIntersectionParameter(line,w * (float)iVar2,componentNdx);
    if ((0.0 < fVar4) && (fVar4 < 1.0)) {
      pfVar3 = Vector<float,_2>::operator[](line + 1,1 - componentNdx);
      fVar1 = *pfVar3;
      pfVar3 = Vector<float,_2>::operator[](line,1 - componentNdx);
      fVar4 = fVar4 * fVar1 + (1.0 - fVar4) * *pfVar3;
      pfVar3 = Vector<float,_2>::operator[](line + 1,componentNdx);
      if (*pfVar3 <= w * (float)iVar2) {
        pfVar3 = Vector<float,_2>::operator[](line + component / 2,componentNdx);
        *pfVar3 = w * (float)iVar2;
        pfVar3 = Vector<float,_2>::operator[](line + component / 2,1 - componentNdx);
        *pfVar3 = fVar4;
      }
      else {
        pfVar3 = Vector<float,_2>::operator[](line + (1 - component / 2),componentNdx);
        *pfVar3 = w * (float)iVar2;
        pfVar3 = Vector<float,_2>::operator[](line + (1 - component / 2),1 - componentNdx);
        *pfVar3 = fVar4;
      }
    }
  }
  return;
}

Assistant:

void applyClippingBox (tcu::Vec2 line[2], float w)
{
	for (int side = 0; side < 4; ++side)
	{
		const int	sign		= ((side / 2) * -2) + 1;
		const int	component	= side % 2;
		const float	t			= calculateIntersectionParameter(line, w * (float)sign, component);

		if ((t > 0) && (t < 1))
		{
			const float newCoord	= t * line[1][1 - component] + (1 - t) * line[0][1 - component];

			if (line[1][component] > (w * (float)sign))
			{
				line[1 - side / 2][component] = w * (float)sign;
				line[1 - side / 2][1 - component] = newCoord;
			}
			else
			{
				line[side / 2][component] = w * (float)sign;
				line[side / 2][1 - component] = newCoord;
			}
		}
	}
}